

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O2

int_t zmemory_usage(int_t nzlmax,int_t nzumax,int_t nzlumax,int n)

{
  return nzumax * 0x14 + nzlmax * 4 + n * 0x28 + nzlumax * 0x10;
}

Assistant:

int_t zmemory_usage(const int_t nzlmax, const int_t nzumax,
		  const int_t nzlumax, const int n)
{
    register int iword, liword, dword;

    iword   = sizeof(int);
    liword  = sizeof(int_t);
    dword   = sizeof(doublecomplex);
    
    return (10 * n * iword +
	    nzlmax * liword + nzumax * (liword + dword) + nzlumax * dword);

}